

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O1

void __thiscall SerialExecutionQueue::~SerialExecutionQueue(SerialExecutionQueue *this)

{
  SerialQueueImpl *this_00;
  thread *ptVar1;
  int iVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  (this->super_ExecutionQueue)._vptr_ExecutionQueue =
       (_func_int **)&PTR__SerialExecutionQueue_002443d8;
  this_00 = this->queue;
  if (this_00 != (SerialQueueImpl *)0x0) {
    anon_unknown.dwarf_556bc6::SerialQueueImpl::~SerialQueueImpl(this_00);
    operator_delete(this_00,0xb0);
  }
  this->queue = (SerialQueueImpl *)0x0;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->killAfterTimeoutThreadMutex);
  if (iVar2 == 0) {
    if ((this->killAfterTimeoutThread)._M_t.
        super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
        super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
        super__Head_base<0UL,_std::thread_*,_false>._M_head_impl != (thread *)0x0) {
      local_30._M_device = &this->queueCompleteMutex;
      local_30._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_30);
      local_30._M_owns = true;
      this->queueComplete = true;
      std::condition_variable::notify_all();
      if (local_30._M_owns == true) {
        std::unique_lock<std::mutex>::unlock(&local_30);
      }
      std::thread::join();
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->killAfterTimeoutThreadMutex);
    std::condition_variable::~condition_variable(&this->queueCompleteCondition);
    ptVar1 = (this->killAfterTimeoutThread)._M_t.
             super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
             super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
             super__Head_base<0UL,_std::thread_*,_false>._M_head_impl;
    if (ptVar1 != (thread *)0x0) {
      if ((ptVar1->_M_id)._M_thread != 0) {
        std::terminate();
      }
      operator_delete(ptVar1,8);
    }
    (this->killAfterTimeoutThread)._M_t.
    super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
    super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
    super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
    llbuild::basic::ProcessGroup::~ProcessGroup(&this->spawnedProcesses);
    llbuild::basic::ExecutionQueue::~ExecutionQueue(&this->super_ExecutionQueue);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

virtual ~SerialExecutionQueue()
  {
    delete queue;
    queue = nullptr;

    std::lock_guard<std::mutex> guard(killAfterTimeoutThreadMutex);
    if (killAfterTimeoutThread) {
      {
        std::unique_lock<std::mutex> lock(queueCompleteMutex);
        queueComplete = true;
        queueCompleteCondition.notify_all();
      }
      killAfterTimeoutThread->join();
    }
  }